

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglframebufferobject.cpp
# Opt level: O2

void __thiscall
QOpenGLFramebufferObjectPrivate::initColorBuffer
          (QOpenGLFramebufferObjectPrivate *this,int idx,GLint *samples)

{
  undefined4 *puVar1;
  void *pvVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  QOpenGLContext *ctx;
  QOpenGLSharedResourceGuard *this_00;
  QOpenGLFramebufferObjectPrivate *this_01;
  int iVar6;
  long in_FS_OFFSET;
  GLuint color_buffer;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ctx = (QOpenGLContext *)QOpenGLContext::currentContext();
  color_buffer = 0;
  pvVar2 = (this->colorAttachments).super_QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>
           .super_QVLABaseBase.ptr;
  puVar1 = (undefined4 *)((long)pvVar2 + (long)idx * 0x18);
  iVar6 = *(int *)((long)pvVar2 + (long)idx * 0x18 + 8);
  cVar3 = QOpenGLContext::isOpenGLES();
  if (cVar3 != '\0') {
    if (puVar1[2] == 0x8052) {
      iVar6 = 0x8059;
    }
    else if (puVar1[2] == 0x1908) {
      bVar4 = QOpenGLExtensions::hasOpenGLExtension((int)this + StencilWrap);
      iVar6 = (uint)bVar4 * 2 + 0x8056;
    }
  }
  (**(code **)(*(long *)&this->funcs + 0x270))(1,&color_buffer);
  (**(code **)(*(long *)&this->funcs + 0x1a0))(0x8d41,color_buffer);
  (**(code **)(*(long *)&this->funcs + 0x540))(0x8d41,*samples,iVar6,*puVar1,puVar1[1]);
  this_01 = (QOpenGLFramebufferObjectPrivate *)0x8d40;
  (**(code **)(*(long *)&this->funcs + 0x248))(0x8d40,idx + 0x8ce0,0x8d41,color_buffer);
  bVar5 = checkFramebufferStatus(this_01,ctx);
  this->field_0x34 = this->field_0x34 & 0xfe | bVar5;
  if (bVar5) {
    (**(code **)(*(long *)&this->funcs + 0x2b8))(0x8d41,0x8cab,samples);
    this_00 = (QOpenGLSharedResourceGuard *)operator_new(0x20);
    QOpenGLSharedResourceGuard::QOpenGLSharedResourceGuard
              (this_00,ctx,color_buffer,anon_unknown.dwarf_88e64::freeRenderbufferFunc);
    *(QOpenGLSharedResourceGuard **)(puVar1 + 4) = this_00;
  }
  else {
    (**(code **)(*(long *)&this->funcs + 0x220))(1,&color_buffer);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLFramebufferObjectPrivate::initColorBuffer(int idx, GLint *samples)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    GLuint color_buffer = 0;

    ColorAttachment &color(colorAttachments[idx]);

    GLenum storageFormat = color.internalFormat;
    // ES requires a sized format. The older desktop extension does not. Correct the format on ES.
    if (ctx->isOpenGLES()) {
        if (color.internalFormat == GL_RGBA) {
            if (funcs.hasOpenGLExtension(QOpenGLExtensions::Sized8Formats))
                storageFormat = GL_RGBA8;
            else
                storageFormat = GL_RGBA4;
        } else if (color.internalFormat == GL_RGB10) {
            // GL_RGB10 is not allowed in ES for glRenderbufferStorage.
            storageFormat = GL_RGB10_A2;
        }
    }

    funcs.glGenRenderbuffers(1, &color_buffer);
    funcs.glBindRenderbuffer(GL_RENDERBUFFER, color_buffer);
    funcs.glRenderbufferStorageMultisample(GL_RENDERBUFFER, *samples, storageFormat, color.size.width(), color.size.height());
    funcs.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + idx,
                                    GL_RENDERBUFFER, color_buffer);

    QT_CHECK_GLERROR();
    valid = checkFramebufferStatus(ctx);
    if (valid) {
        // Query the actual number of samples. This can be greater than the requested
        // value since the typically supported values are 0, 4, 8, ..., and the
        // requests are mapped to the next supported value.
        funcs.glGetRenderbufferParameteriv(GL_RENDERBUFFER, GL_RENDERBUFFER_SAMPLES, samples);
        color.guard = new QOpenGLSharedResourceGuard(ctx, color_buffer, freeRenderbufferFunc);
    } else {
        funcs.glDeleteRenderbuffers(1, &color_buffer);
    }
}